

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaBasicItemPtr
xmlSchemaParseElement
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int *isElemRef,
          int topLevel)

{
  xmlSchemaBucketPtr_conflict pxVar1;
  _xmlAttr *p_Var2;
  xmlSchemaTypeType xVar3;
  bool bVar4;
  undefined1 *puVar5;
  xmlChar *pxVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  xmlAttrPtr pxVar10;
  xmlNodePtr pxVar11;
  xmlSchemaTreeItemPtr annot;
  xmlSchemaTypePtr pxVar12;
  xmlSchemaTreeItemPtr_conflict __s;
  xmlSchemaTreeItemPtr *value;
  xmlSchemaTreeItemPtr *ppxVar13;
  xmlSchemaTreeItemPtr pxVar14;
  xmlSchemaTypePtr attr;
  xmlNodePtr pxVar15;
  xmlNodePtr pxVar16;
  xmlNs *pxVar17;
  xmlSchemaTreeItemPtr_conflict pxVar18;
  xmlSchemaAnnotPtr pxVar19;
  _xmlNode *p_Var20;
  _xmlSchemaType *p_Var21;
  xmlSchemaQNameRefPtr pxVar22;
  int *piVar23;
  xmlAttrPtr attr_00;
  char *type;
  xmlNodePtr pxVar24;
  xmlChar *name_00;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar25;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlChar *name_01;
  xmlChar *extraout_RDX_04;
  xmlChar *extraout_RDX_05;
  xmlChar *pxVar26;
  xmlSchemaPtr pxVar27;
  xmlSchemaPtr node_00;
  xmlParserErrors error;
  char *str2;
  xmlSchemaItemListPtr *list;
  undefined4 in_register_00000084;
  xmlAttrPtr attr_01;
  char *child;
  xmlSchemaTreeItemPtr *in_R9;
  char *uri;
  _xmlAttr **pp_Var28;
  xmlChar **in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  xmlSchemaPtr ownerItem;
  xmlSchemaParserCtxtPtr in_stack_ffffffffffffff70;
  xmlSchemaTreeItemPtr_conflict pxVar29;
  _xmlSchemaType *local_68;
  xmlSchemaParticlePtr local_50;
  xmlChar *name;
  xmlChar *refNs;
  _xmlSchemaType *local_38;
  
  child = (char *)CONCAT44(in_register_00000084,topLevel);
  if (isElemRef != (int *)0x0) {
    *isElemRef = 0;
  }
  piVar23 = isElemRef;
  pxVar10 = xmlSchemaGetPropNode(node,"name");
  pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"ref");
  if (pxVar10 == (xmlAttrPtr)0x0 && (pxVar11 == (xmlNodePtr)0x0 || topLevel != 0)) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1c0014,
               (xmlNodePtr)
               CONCAT71((int7)((ulong)piVar23 >> 8),pxVar11 == (xmlNodePtr)0x0 || topLevel != 0),
               child,(char *)in_R9);
    return (xmlSchemaBasicItemPtr)0x0;
  }
  xmlSchemaPValAttrID(ctxt,node,name_00);
  node_00 = (xmlSchemaPtr)node->children;
  if (node_00 == (xmlSchemaPtr)0x0) {
    node_00 = (xmlSchemaPtr)0x0;
LAB_00190e10:
    annot = (xmlSchemaTreeItemPtr)0x0;
  }
  else {
    if ((((xmlNs *)node_00->attrgrpDecl == (xmlNs *)0x0) ||
        (iVar7 = xmlStrEqual(node_00->version,(xmlChar *)"annotation"), iVar7 == 0)) ||
       (iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
    goto LAB_00190e10;
    annot = (xmlSchemaTreeItemPtr)xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)node_00,1);
    node_00 = *(xmlSchemaPtr *)&node_00->flags;
  }
  if (topLevel == 0) {
    uVar8 = xmlGetMinOccurs(ctxt,node,-1,0x1d7cdf,(int)child,(char *)in_R9);
    child = "(xs:nonNegativeInteger | unbounded)";
    iVar7 = xmlGetMaxOccurs(ctxt,node,0,0x40000000,0x1d7cf5,(char *)in_R9);
    xmlSchemaPCheckParticleCorrect_2
              (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar8,iVar7,(int)child);
    local_50 = xmlSchemaAddParticle(ctxt,node,uVar8,iVar7);
    if (local_50 == (xmlSchemaParticlePtr)0x0) {
      if (annot == (xmlSchemaTreeItemPtr)0x0) {
        return (xmlSchemaBasicItemPtr)0x0;
      }
      goto LAB_00191038;
    }
    in_stack_ffffffffffffff70 = ctxt;
    if (pxVar11 == (xmlNodePtr)0x0) goto LAB_00190e26;
    refNs = (xmlChar *)0x0;
    name = (xmlChar *)0x0;
    if (isElemRef != (int *)0x0) {
      *isElemRef = 1;
    }
    attr_01 = (xmlAttrPtr)&name;
    xmlSchemaPValAttrNodeQName
              (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar11,(xmlAttrPtr)&refNs,(xmlChar **)attr_01,
               (xmlChar **)in_R9);
    pxVar26 = refNs;
    attr_00 = (xmlAttrPtr)refNs;
    xmlSchemaCheckReference(ctxt,(xmlSchemaPtr)node,pxVar11,(xmlAttrPtr)refNs,(xmlChar *)attr_01);
    if (pxVar10 != (xmlAttrPtr)0x0) {
      attr_01 = (xmlAttrPtr)0x1d5d05;
      in_R9 = (xmlSchemaTreeItemPtr *)0x1c0014;
      xmlSchemaPMutualExclAttrErr
                (ctxt,XML_SCHEMAP_SRC_ELEMENT_2_1,(xmlSchemaBasicItemPtr)0x0,pxVar10,"ref","name");
      attr_00 = pxVar10;
    }
    pp_Var28 = &node->properties;
    while (p_Var2 = *pp_Var28, p_Var2 != (_xmlAttr *)0x0) {
      if (p_Var2->ns == (xmlNs *)0x0) {
        iVar9 = xmlStrEqual(p_Var2->name,"ref");
        if (((iVar9 == 0) && (iVar9 = xmlStrEqual(p_Var2->name,"name"), iVar9 == 0)) &&
           ((iVar9 = xmlStrEqual(p_Var2->name,"id"), iVar9 == 0 &&
            ((iVar9 = xmlStrEqual(p_Var2->name,(xmlChar *)"maxOccurs"), iVar9 == 0 &&
             (iVar9 = xmlStrEqual(p_Var2->name,(xmlChar *)"minOccurs"), iVar9 == 0)))))) {
          xmlSchemaPCustomAttrErr
                    (ctxt,XML_SCHEMAP_SRC_ELEMENT_2_2,(xmlChar **)p_Var2,
                     (xmlSchemaBasicItemPtr)
                     "Only the attributes \'minOccurs\', \'maxOccurs\' and \'id\' are allowed in addition to \'ref\'"
                     ,attr_01,(char *)in_R9);
          break;
        }
      }
      else {
        iVar9 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        if (iVar9 != 0) {
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var2,ownerComp,attr_00);
        }
      }
      pp_Var28 = &p_Var2->next;
    }
    if (node_00 != (xmlSchemaPtr)0x0) {
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                 (xmlNodePtr)node_00,(xmlNodePtr)0x0,"(annotation?)",
                 (char *)in_stack_ffffffffffffff58);
    }
    if ((iVar7 != 0 || uVar8 != 0) &&
       (pxVar22 = xmlSchemaNewQNameRef(ctxt,XML_SCHEMA_TYPE_ELEMENT,name,pxVar26),
       pxVar22 != (xmlSchemaQNameRefPtr)0x0)) {
      local_50->children = (xmlSchemaTreeItemPtr_conflict)pxVar22;
      local_50->annot = (xmlSchemaAnnotPtr)annot;
      iVar7 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,local_50);
      if (iVar7 < 0) {
        xmlSchemaPErrMemory(ctxt);
        return (xmlSchemaBasicItemPtr)local_50;
      }
      return (xmlSchemaBasicItemPtr)local_50;
    }
  }
  else {
    local_50 = (xmlSchemaParticlePtr)0x0;
LAB_00190e26:
    pxVar12 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    type = (char *)&name;
    iVar7 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)pxVar10,(xmlAttrPtr)pxVar12,
                       (xmlSchemaTypePtr)type,(xmlChar **)child);
    if (iVar7 == 0) {
      if (topLevel == 0) {
        pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"form");
        if (pxVar11 == (xmlNodePtr)0x0) {
          if ((schema->flags & 1) != 0) goto LAB_00191022;
          pxVar26 = (xmlChar *)0x0;
          uri = (char *)in_R9;
        }
        else {
          uri = (char *)xmlSchemaGetNodeContent(ctxt,pxVar11);
          iVar7 = xmlStrEqual((xmlChar *)uri,"qualified");
          if (iVar7 == 0) {
            iVar7 = xmlStrEqual((xmlChar *)uri,(xmlChar *)"unqualified");
            if (iVar7 == 0) {
              in_stack_ffffffffffffff58 = (xmlChar **)0x0;
              in_stack_ffffffffffffff60 = 0;
              child = "(qualified | unqualified)";
              pxVar26 = (xmlChar *)0x0;
              type = (char *)0x0;
              xmlSchemaPSimpleTypeErr
                        (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                         (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",uri,
                         (xmlChar *)0x0,(char *)0x0,(xmlChar *)node_00,
                         (xmlChar *)in_stack_ffffffffffffff70);
            }
            else {
              pxVar26 = (xmlChar *)0x0;
              uri = (char *)in_R9;
            }
          }
          else {
            pxVar26 = ctxt->targetNamespace;
            uri = (char *)in_R9;
          }
        }
      }
      else {
LAB_00191022:
        pxVar26 = ctxt->targetNamespace;
        uri = (char *)in_R9;
      }
      pxVar6 = name;
      if (name != (xmlChar *)0x0) {
        __s = (xmlSchemaTreeItemPtr_conflict)(*xmlMalloc)(200);
        if (__s == (xmlSchemaTreeItemPtr_conflict)0x0) {
          xmlSchemaPErrMemory(ctxt);
        }
        else {
          pxVar18 = __s;
          memset(__s,0,200);
          __s->type = XML_SCHEMA_TYPE_ELEMENT;
          __s->next = (xmlSchemaTreeItemPtr)pxVar6;
          *(xmlChar **)(__s + 3) = pxVar26;
          __s[2].annot = (xmlSchemaAnnotPtr)node;
          pxVar1 = ctxt->constructor->bucket;
          if (topLevel == 0) {
            list = &pxVar1->locals;
            iVar7 = 10;
          }
          else {
            list = &pxVar1->globals;
            iVar7 = 5;
          }
          iVar7 = xmlSchemaAddItemSize(list,iVar7,__s);
          if (-1 < iVar7) {
            iVar7 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,__s);
            if (iVar7 < 0) {
              xmlSchemaPErrMemory(ctxt);
            }
            pp_Var28 = &node->properties;
            while( true ) {
              iVar7 = (int)in_stack_ffffffffffffff60;
              p_Var2 = *pp_Var28;
              if (p_Var2 == (_xmlAttr *)0x0) break;
              if (p_Var2->ns == (xmlNs *)0x0) {
                iVar7 = xmlStrEqual(p_Var2->name,"name");
                if (((iVar7 == 0) && (iVar7 = xmlStrEqual(p_Var2->name,"type"), iVar7 == 0)) &&
                   ((((iVar7 = xmlStrEqual(p_Var2->name,"id"), iVar7 == 0 &&
                      ((iVar7 = xmlStrEqual(p_Var2->name,"default"), iVar7 == 0 &&
                       (iVar7 = xmlStrEqual(p_Var2->name,(xmlChar *)"fixed"), iVar7 == 0)))) &&
                     (iVar7 = xmlStrEqual(p_Var2->name,(xmlChar *)"block"), iVar7 == 0)) &&
                    (iVar7 = xmlStrEqual(p_Var2->name,(xmlChar *)"nillable"), iVar7 == 0)))) {
                  if (topLevel == 0) {
                    iVar7 = xmlStrEqual(p_Var2->name,(xmlChar *)"maxOccurs");
                    if ((iVar7 == 0) &&
                       (iVar7 = xmlStrEqual(p_Var2->name,(xmlChar *)"minOccurs"), iVar7 == 0)) {
                      pxVar26 = p_Var2->name;
                      str2 = "form";
                      goto LAB_001912fe;
                    }
                  }
                  else {
                    iVar7 = xmlStrEqual(p_Var2->name,(xmlChar *)"final");
                    if ((iVar7 == 0) && (iVar7 = xmlStrEqual(p_Var2->name,"abstract"), iVar7 == 0))
                    {
                      pxVar26 = p_Var2->name;
                      str2 = "substitutionGroup";
LAB_001912fe:
                      iVar7 = xmlStrEqual(pxVar26,(xmlChar *)str2);
                      pxVar25 = extraout_RDX_00;
                      if (iVar7 == 0) goto LAB_001911f4;
                    }
                  }
                }
              }
              else {
                iVar7 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
                pxVar25 = extraout_RDX;
                if (iVar7 != 0) {
LAB_001911f4:
                  xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var2,pxVar25,(xmlAttrPtr)type);
                }
              }
              pp_Var28 = &p_Var2->next;
            }
            pxVar27 = node_00;
            pxVar29 = pxVar18;
            if (topLevel != 0) {
              *(byte *)&__s[2].children = *(byte *)&__s[2].children | 0x22;
              ppxVar13 = &pxVar18[2].children;
              child = (char *)(pxVar18 + 4);
              uri = (char *)&pxVar18[3].children;
              type = "substitutionGroup";
              xmlSchemaPValAttrQName
                        (ctxt,schema,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)"substitutionGroup",
                         child,(xmlChar **)uri,in_stack_ffffffffffffff58);
              iVar9 = xmlGetBooleanProp(ctxt,node,"abstract",(int)type);
              if (iVar9 != 0) {
                *(byte *)ppxVar13 = *(byte *)ppxVar13 | 0x10;
              }
              pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"final");
              if (pxVar11 == (xmlNodePtr)0x0) {
                uVar8 = schema->flags;
                if ((uVar8 & 4) != 0) {
                  puVar5 = (undefined1 *)((long)&pxVar18[2].children + 1);
                  *puVar5 = *puVar5 | 0x80;
                }
                if ((uVar8 & 8) != 0) {
                  puVar5 = (undefined1 *)((long)&pxVar18[2].children + 2);
                  *puVar5 = *puVar5 | 1;
                }
              }
              else {
                value = (xmlSchemaTreeItemPtr *)xmlSchemaGetNodeContent(ctxt,pxVar11);
                in_stack_ffffffffffffff58 =
                     (xmlChar **)
                     CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),0xffffffff);
                child = (char *)0xffffffffffffffff;
                type = (char *)0x10000;
                uri = (char *)0xffffffff;
                iVar9 = xmlSchemaPValAttrBlockFinal
                                  ((xmlChar *)value,(int *)ppxVar13,0x8000,0x10000,-1,-1,-1,iVar7);
                if (iVar9 != 0) {
                  in_stack_ffffffffffffff58 = (xmlChar **)0x0;
                  iVar7 = 0;
                  child = "(#all | List of (extension | restriction))";
                  type = (char *)0x0;
                  xmlSchemaPSimpleTypeErr
                            (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                             (xmlNodePtr)0x0,
                             (xmlSchemaTypePtr)"(#all | List of (extension | restriction))",
                             (char *)value,(xmlChar *)0x0,(char *)0x0,(xmlChar *)pxVar27,
                             (xmlChar *)pxVar29);
                  uri = (char *)value;
                }
              }
            }
            iVar9 = (int)type;
            pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"block");
            if (pxVar11 == (xmlNodePtr)0x0) {
              uVar8 = schema->flags;
              if ((char)uVar8 < '\0') {
                puVar5 = (undefined1 *)((long)&__s[2].children + 1);
                *puVar5 = *puVar5 | 0x10;
              }
              if ((uVar8 & 0x40) != 0) {
                puVar5 = (undefined1 *)((long)&__s[2].children + 1);
                *puVar5 = *puVar5 | 8;
              }
              if ((uVar8 >> 8 & 1) != 0) {
                puVar5 = (undefined1 *)((long)&__s[2].children + 1);
                *puVar5 = *puVar5 | 0x20;
              }
            }
            else {
              ppxVar13 = (xmlSchemaTreeItemPtr *)xmlSchemaGetNodeContent(ctxt,pxVar11);
              in_stack_ffffffffffffff58 =
                   (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),0xffffffff);
              uri = (char *)0xffffffffffffffff;
              iVar9 = 0x1000;
              child = (char *)0x2000;
              iVar7 = xmlSchemaPValAttrBlockFinal
                                ((xmlChar *)ppxVar13,(int *)&pxVar29[2].children,0x800,0x1000,0x2000
                                 ,-1,-1,iVar7);
              if (iVar7 != 0) {
                in_stack_ffffffffffffff58 = (xmlChar **)0x0;
                child = "(#all | List of (extension | restriction | substitution))";
                iVar9 = 0;
                xmlSchemaPSimpleTypeErr
                          (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                           (xmlNodePtr)0x0,
                           (xmlSchemaTypePtr)
                           "(#all | List of (extension | restriction | substitution))",
                           (char *)ppxVar13,(xmlChar *)0x0,(char *)0x0,(xmlChar *)pxVar27,
                           (xmlChar *)pxVar29);
                uri = (char *)ppxVar13;
              }
            }
            iVar7 = xmlGetBooleanProp(ctxt,node,"nillable",iVar9);
            if (iVar7 != 0) {
              *(byte *)&__s[2].children = *(byte *)&__s[2].children | 1;
            }
            pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"type");
            if (pxVar11 != (xmlNodePtr)0x0) {
              child = (char *)&pxVar29[3].annot;
              xmlSchemaPValAttrNodeQName
                        (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar11,(xmlAttrPtr)&pxVar29[3].next,
                         (xmlChar **)child,(xmlChar **)uri);
              xmlSchemaCheckReference
                        (ctxt,(xmlSchemaPtr)node,pxVar11,(xmlAttrPtr)__s[3].next,(xmlChar *)child);
            }
            pxVar14 = (xmlSchemaTreeItemPtr)xmlSchemaGetProp(ctxt,node,"default");
            __s[4].next = pxVar14;
            pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(node,"fixed");
            if (pxVar11 != (xmlNodePtr)0x0) {
              pxVar14 = (xmlSchemaTreeItemPtr)xmlSchemaGetNodeContent(ctxt,pxVar11);
              if (__s[4].next == (xmlSchemaTreeItemPtr)0x0) {
                *(byte *)&__s[2].children = *(byte *)&__s[2].children | 8;
                __s[4].next = pxVar14;
              }
              else {
                child = "default";
                uri = "fixed";
                xmlSchemaPMutualExclAttrErr
                          (ctxt,XML_SCHEMAP_SRC_ELEMENT_1,(xmlSchemaBasicItemPtr)0x0,
                           (xmlAttrPtr)pxVar11,"default","fixed");
              }
            }
            if (node_00 == (xmlSchemaPtr)0x0) {
              node_00 = (xmlSchemaPtr)0x0;
              goto LAB_0019167e;
            }
            if ((xmlNs *)node_00->attrgrpDecl == (xmlNs *)0x0) goto LAB_0019167e;
            iVar7 = xmlStrEqual(node_00->version,(xmlChar *)"complexType");
            if ((iVar7 == 0) ||
               (iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0)) {
              if (((xmlNs *)node_00->attrgrpDecl == (xmlNs *)0x0) ||
                 ((iVar7 = xmlStrEqual(node_00->version,"simpleType"), iVar7 == 0 ||
                  (iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                                       (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0)))
                 ) goto LAB_0019167e;
              if (__s[3].annot != (xmlSchemaAnnotPtr)0x0) {
                child = "The attribute \'type\' and the <simpleType> child are mutually exclusive";
                goto LAB_00191636;
              }
              pxVar12 = xmlSchemaParseSimpleType(ctxt,schema,(xmlNodePtr)node_00,0);
LAB_00191676:
              __s[1].children = (xmlSchemaTreeItemPtr)pxVar12;
            }
            else {
              if (__s[3].annot == (xmlSchemaAnnotPtr)0x0) {
                pxVar12 = xmlSchemaParseComplexType(ctxt,schema,(xmlNodePtr)node_00,0);
                goto LAB_00191676;
              }
              child = "The attribute \'type\' and the <complexType> child are mutually exclusive";
LAB_00191636:
              uri = (char *)0x0;
              xmlSchemaPContentErr
                        (ctxt,XML_SCHEMAP_SRC_ELEMENT_3,(xmlSchemaBasicItemPtr)node,
                         (xmlNodePtr)node_00,(xmlNodePtr)child,(char *)0x0,
                         (char *)in_stack_ffffffffffffff58);
            }
            node_00 = *(xmlSchemaPtr *)&node_00->flags;
LAB_0019167e:
            pxVar29 = pxVar29 + 6;
            pxVar11 = (xmlNodePtr)0x0;
            do {
              if (node_00 == (xmlSchemaPtr)0x0) {
LAB_00191cf0:
                __s[1].next = annot;
                if (topLevel == 0) {
                  local_50->children = __s;
                  return (xmlSchemaBasicItemPtr)local_50;
                }
                return (xmlSchemaBasicItemPtr)__s;
              }
              if (((xmlNs *)node_00->attrgrpDecl == (xmlNs *)0x0) ||
                 (((iVar7 = xmlStrEqual(node_00->version,(xmlChar *)"unique"), iVar7 == 0 ||
                   (iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
                  && (((xmlNs *)node_00->attrgrpDecl == (xmlNs *)0x0 ||
                      (((iVar7 = xmlStrEqual(node_00->version,(xmlChar *)"key"), iVar7 == 0 ||
                        (iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                                             (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                        iVar7 == 0)) &&
                       (((xmlNs *)node_00->attrgrpDecl == (xmlNs *)0x0 ||
                        ((iVar7 = xmlStrEqual(node_00->version,"keyref"), iVar7 == 0 ||
                         (iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                                              (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                         iVar7 == 0)))))))))))) {
                xmlSchemaPContentErr
                          (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,
                           (xmlNodePtr)node_00,(xmlNodePtr)0x0,
                           "(annotation?, ((simpleType | complexType)?, (unique | key | keyref)*))",
                           (char *)in_stack_ffffffffffffff58);
                goto LAB_00191cf0;
              }
              pxVar24 = pxVar11;
              if ((xmlNs *)node_00->attrgrpDecl != (xmlNs *)0x0) {
                pxVar15 = pxVar11;
                iVar7 = xmlStrEqual(node_00->version,(xmlChar *)"unique");
                if ((iVar7 == 0) ||
                   (iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
                {
                  if ((xmlNs *)node_00->attrgrpDecl != (xmlNs *)0x0) {
                    pxVar15 = pxVar11;
                    iVar7 = xmlStrEqual(node_00->version,(xmlChar *)"key");
                    if ((iVar7 != 0) &&
                       (iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                       iVar7 != 0)) {
                      xVar3 = XML_SCHEMA_TYPE_IDC_KEY;
                      goto LAB_001917d7;
                    }
                    if (((xmlNs *)node_00->attrgrpDecl != (xmlNs *)0x0) &&
                       (iVar7 = xmlStrEqual(node_00->version,"keyref"), iVar7 != 0)) {
                      iVar7 = xmlStrEqual(((xmlNs *)node_00->attrgrpDecl)->href,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                      bVar4 = true;
                      xVar3 = XML_SCHEMA_TYPE_IDC_KEYREF;
                      pxVar15 = pxVar11;
                      if (iVar7 != 0) goto LAB_001917dc;
                    }
                  }
                }
                else {
                  xVar3 = XML_SCHEMA_TYPE_IDC_UNIQUE;
LAB_001917d7:
                  bVar4 = false;
LAB_001917dc:
                  local_38 = *(_xmlSchemaType **)(__s + 3);
                  refNs = (xmlChar *)0x0;
                  pp_Var28 = (_xmlAttr **)&node_00->notaDecl;
                  while (p_Var2 = *pp_Var28, p_Var2 != (_xmlAttr *)0x0) {
                    if (p_Var2->ns == (xmlNs *)0x0) {
                      iVar7 = xmlStrEqual(p_Var2->name,"id");
                      if (((iVar7 == 0) && (iVar7 = xmlStrEqual(p_Var2->name,"name"), iVar7 == 0))
                         && ((pxVar25 = extraout_RDX_02, !bVar4 ||
                             (iVar7 = xmlStrEqual(p_Var2->name,"refer"), pxVar25 = extraout_RDX_03,
                             iVar7 == 0)))) goto LAB_00191823;
                    }
                    else {
                      iVar7 = xmlStrEqual(p_Var2->ns->href,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                      pxVar25 = extraout_RDX_01;
                      if (iVar7 != 0) {
LAB_00191823:
                        xmlSchemaPIllegalAttrErr
                                  (ctxt,(xmlParserErrors)p_Var2,pxVar25,(xmlAttrPtr)pxVar15);
                      }
                    }
                    pp_Var28 = &p_Var2->next;
                  }
                  pxVar27 = node_00;
                  pxVar10 = xmlSchemaGetPropNode((xmlNodePtr)node_00,"name");
                  if (pxVar10 == (xmlAttrPtr)0x0) {
                    xmlSchemaPMissingAttrErr
                              (ctxt,(xmlParserErrors)node_00,(xmlSchemaBasicItemPtr)0x1c0014,pxVar15
                               ,child,uri);
                    node_00 = pxVar27;
                  }
                  else {
                    attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                    pxVar12 = (xmlSchemaTypePtr)&refNs;
                    iVar7 = xmlSchemaPValAttrNode
                                      (ctxt,(xmlSchemaBasicItemPtr)pxVar10,(xmlAttrPtr)attr,pxVar12,
                                       (xmlChar **)child);
                    pxVar26 = refNs;
                    node_00 = pxVar27;
                    if ((iVar7 == 0) && (refNs != (xmlChar *)0x0)) {
                      pxVar15 = (xmlNodePtr)(*xmlMalloc)(0x50);
                      if (pxVar15 == (xmlNodePtr)0x0) {
                        xmlSchemaPErrMemory(ctxt);
                        node_00 = pxVar27;
                      }
                      else {
                        pxVar15->last = (_xmlNode *)0x0;
                        pxVar15->parent = (_xmlNode *)0x0;
                        pxVar15->_private = (void *)0x0;
                        *(xmlSchemaAnnotPtr *)&pxVar15->type = (xmlSchemaAnnotPtr)0x0;
                        pxVar15->name = (xmlChar *)0x0;
                        pxVar15->children = (xmlNodePtr)0x0;
                        pxVar15->doc = (_xmlDoc *)0x0;
                        pxVar15->ns = (xmlNs *)0x0;
                        pxVar15->next = (_xmlNode *)0x0;
                        pxVar15->prev = (_xmlNode *)0x0;
                        pxVar15->parent = (_xmlNode *)local_38;
                        pxVar15->last = (_xmlNode *)pxVar26;
                        *(xmlSchemaTypeType *)&pxVar15->_private = xVar3;
                        pxVar15->children = (_xmlNode *)pxVar27;
                        iVar7 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->globals,5,pxVar15);
                        if (-1 < iVar7) {
                          if (bVar4) {
                            iVar7 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,pxVar15);
                            pxVar26 = extraout_RDX_04;
                            node_00 = pxVar27;
                            if (iVar7 < 0) {
                              xmlSchemaPErrMemory(ctxt);
                              pxVar26 = extraout_RDX_05;
                            }
                            xmlSchemaPValAttrID(ctxt,(xmlNodePtr)pxVar27,pxVar26);
                            pxVar16 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)pxVar27,"refer");
                            if (pxVar16 == (xmlNodePtr)0x0) {
                              xmlSchemaPMissingAttrErr
                                        (ctxt,(xmlParserErrors)pxVar27,
                                         (xmlSchemaBasicItemPtr)0x1c47d7,(xmlNodePtr)pxVar12,child,
                                         uri);
                              ownerItem = node_00;
                            }
                            else {
                              pxVar17 = (xmlNs *)xmlSchemaNewQNameRef
                                                           (ctxt,XML_SCHEMA_TYPE_IDC_KEY,
                                                            (xmlChar *)0x0,(xmlChar *)0x0);
                              pxVar15->ns = pxVar17;
                              pxVar24 = (xmlNodePtr)0x0;
                              if (pxVar17 == (xmlNs *)0x0) goto LAB_00191a53;
                              child = (char *)&pxVar17->prefix;
                              pxVar27 = node_00;
                              xmlSchemaPValAttrNodeQName
                                        (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar16,
                                         (xmlAttrPtr)&pxVar17->_private,(xmlChar **)child,
                                         (xmlChar **)uri);
                              ownerItem = pxVar27;
                              xmlSchemaCheckReference
                                        (ctxt,pxVar27,pxVar16,(xmlAttrPtr)pxVar15->ns->_private,
                                         (xmlChar *)child);
                            }
                          }
                          else {
                            ownerItem = pxVar27;
                            xmlSchemaPValAttrID(ctxt,(xmlNodePtr)pxVar27,name_01);
                          }
                          pxVar16 = (xmlNodePtr)pxVar27->id;
                          pxVar24 = pxVar15;
                          if (pxVar16 == (xmlNodePtr)0x0) {
LAB_00191c71:
                            error = XML_SCHEMAP_S4S_ELEM_MISSING;
                            pxVar16 = (xmlNodePtr)0x0;
                            child = "A child element is missing";
                            node_00 = ownerItem;
                          }
                          else {
                            if (((pxVar16->ns != (xmlNs *)0x0) &&
                                (iVar7 = xmlStrEqual(pxVar16->name,(xmlChar *)"annotation"),
                                iVar7 != 0)) &&
                               (iVar7 = xmlStrEqual(pxVar16->ns->href,
                                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                               iVar7 != 0)) {
                              pxVar19 = xmlSchemaParseAnnotation(ctxt,pxVar16,1);
                              *(xmlSchemaAnnotPtr *)&pxVar15->type = pxVar19;
                              pxVar16 = pxVar16->next;
                              if (pxVar16 == (_xmlNode *)0x0) goto LAB_00191c71;
                            }
                            pxVar27 = ownerItem;
                            if (((pxVar16->ns != (xmlNs *)0x0) &&
                                (iVar7 = xmlStrEqual(pxVar16->name,(xmlChar *)"selector"),
                                pxVar27 = ownerItem, iVar7 != 0)) &&
                               (iVar7 = xmlStrEqual(pxVar16->ns->href,
                                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                               pxVar27 = ownerItem, iVar7 != 0)) {
                              p_Var20 = (_xmlNode *)
                                        xmlSchemaParseIDCSelectorAndField
                                                  (ctxt,(xmlSchemaIDCPtr_conflict)pxVar15,pxVar16,0)
                              ;
                              pxVar15->next = p_Var20;
                              pxVar16 = pxVar16->next;
                              if (pxVar16 == (xmlNodePtr)0x0) {
                                pxVar16 = (xmlNodePtr)0x0;
                                pxVar27 = ownerItem;
                              }
                              else {
                                node_00 = ownerItem;
                                if (((pxVar16->ns == (xmlNs *)0x0) ||
                                    (iVar7 = xmlStrEqual(pxVar16->name,(xmlChar *)"field"),
                                    iVar7 == 0)) ||
                                   (iVar7 = xmlStrEqual(pxVar16->ns->href,
                                                        (xmlChar *)
                                                        "http://www.w3.org/2001/XMLSchema"),
                                   iVar7 == 0)) {
                                  xmlSchemaPContentErr
                                            (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                                             (xmlSchemaBasicItemPtr)ownerItem,pxVar16,
                                             (xmlNodePtr)0x0,"(annotation?, (selector, field+))",
                                             (char *)in_stack_ffffffffffffff58);
                                  pxVar27 = node_00;
                                }
                                else {
                                  local_38 = (_xmlSchemaType *)&pxVar15->prev;
                                  local_68 = (_xmlSchemaType *)0x0;
                                  do {
                                    p_Var21 = (_xmlSchemaType *)
                                              xmlSchemaParseIDCSelectorAndField
                                                        (ctxt,(xmlSchemaIDCPtr_conflict)pxVar15,
                                                         pxVar16,1);
                                    if (p_Var21 != (_xmlSchemaType *)0x0) {
                                      iVar7 = *(int *)&pxVar15->doc;
                                      *(int *)&p_Var21->name = iVar7;
                                      *(int *)&pxVar15->doc = iVar7 + 1;
                                      if (local_68 == (_xmlSchemaType *)0x0) {
                                        local_68 = local_38;
                                      }
                                      *(_xmlSchemaType **)local_68 = p_Var21;
                                      local_68 = p_Var21;
                                    }
                                    pxVar16 = pxVar16->next;
                                    if (pxVar16 == (xmlNodePtr)0x0) goto LAB_00191a53;
                                    pxVar27 = node_00;
                                  } while (((pxVar16->ns != (xmlNs *)0x0) &&
                                           (iVar7 = xmlStrEqual(pxVar16->name,(xmlChar *)"field"),
                                           pxVar27 = node_00, iVar7 != 0)) &&
                                          (iVar7 = xmlStrEqual(pxVar16->ns->href,
                                                               (xmlChar *)
                                                               "http://www.w3.org/2001/XMLSchema"),
                                          pxVar27 = node_00, iVar7 != 0));
                                }
                              }
                            }
                            error = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
                            child = (char *)0x0;
                            node_00 = pxVar27;
                          }
                          uri = "(annotation?, (selector, field+))";
                          xmlSchemaPContentErr
                                    (ctxt,error,(xmlSchemaBasicItemPtr)pxVar27,pxVar16,
                                     (xmlNodePtr)child,"(annotation?, (selector, field+))",
                                     (char *)in_stack_ffffffffffffff58);
                          goto LAB_00191a53;
                        }
                        xmlSchemaPErrMemory(ctxt);
                        (*xmlFree)(pxVar15);
                        node_00 = pxVar27;
                      }
                    }
                  }
                  pxVar24 = (xmlNodePtr)0x0;
                }
              }
LAB_00191a53:
              pxVar18 = (xmlSchemaTreeItemPtr_conflict)&pxVar11->name;
              if (pxVar11 == (xmlNodePtr)0x0) {
                pxVar18 = pxVar29;
              }
              *(xmlNodePtr *)pxVar18 = pxVar24;
              node_00 = *(xmlSchemaPtr *)&node_00->flags;
              pxVar11 = pxVar24;
            } while( true );
          }
          xmlSchemaPErrMemory(ctxt);
          (*xmlFree)(__s);
        }
      }
    }
  }
  if (annot == (xmlSchemaTreeItemPtr)0x0) {
    return (xmlSchemaBasicItemPtr)0x0;
  }
  if (local_50 != (xmlSchemaParticlePtr)0x0) {
    local_50->annot = (xmlSchemaAnnotPtr)0x0;
  }
LAB_00191038:
  xmlSchemaFreeAnnot((xmlSchemaAnnotPtr)annot);
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaParseElement(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      xmlNodePtr node, int *isElemRef, int topLevel)
{
    xmlSchemaElementPtr decl = NULL;
    xmlSchemaParticlePtr particle = NULL;
    xmlSchemaAnnotPtr annot = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr, nameAttr;
    int min, max, isRef = 0;
    xmlChar *des = NULL;

    /* 3.3.3 Constraints on XML Representations of Element Declarations */
    /* TODO: Complete implementation of 3.3.6 */

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (isElemRef != NULL)
	*isElemRef = 0;
    /*
    * If we get a "ref" attribute on a local <element> we will assume it's
    * a reference - even if there's a "name" attribute; this seems to be more
    * robust.
    */
    nameAttr = xmlSchemaGetPropNode(node, "name");
    attr = xmlSchemaGetPropNode(node, "ref");
    if ((topLevel) || (attr == NULL)) {
	if (nameAttr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node, "name", NULL);
	    return (NULL);
	}
    } else
	isRef = 1;

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    /*
    * Skip particle part if a global declaration.
    */
    if (topLevel)
	goto declaration_part;
    /*
    * The particle part ==================================================
    */
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1, "(xs:nonNegativeInteger | unbounded)");
    xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
    particle = xmlSchemaAddParticle(ctxt, node, min, max);
    if (particle == NULL)
	goto return_null;

    /* ret->flags |= XML_SCHEMAS_ELEM_REF; */

    if (isRef) {
	const xmlChar *refNs = NULL, *ref = NULL;
	xmlSchemaQNameRefPtr refer = NULL;
	/*
	* The reference part =============================================
	*/
	if (isElemRef != NULL)
	    *isElemRef = 1;

	xmlSchemaPValAttrNodeQName(ctxt, schema,
	    NULL, attr, &refNs, &ref);
	xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
	/*
	* SPEC (3.3.3 : 2.1) "One of ref or name must be present, but not both"
	*/
	if (nameAttr != NULL) {
	    xmlSchemaPMutualExclAttrErr(ctxt,
		XML_SCHEMAP_SRC_ELEMENT_2_1, NULL, nameAttr, "ref", "name");
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (xmlStrEqual(attr->name, BAD_CAST "ref") ||
		    xmlStrEqual(attr->name, BAD_CAST "name") ||
		    xmlStrEqual(attr->name, BAD_CAST "id") ||
		    xmlStrEqual(attr->name, BAD_CAST "maxOccurs") ||
		    xmlStrEqual(attr->name, BAD_CAST "minOccurs"))
		{
		    attr = attr->next;
		    continue;
		} else {
		    /* SPEC (3.3.3 : 2.2) */
		    xmlSchemaPCustomAttrErr(ctxt,
			XML_SCHEMAP_SRC_ELEMENT_2_2,
			NULL, NULL, attr,
			"Only the attributes 'minOccurs', 'maxOccurs' and "
			"'id' are allowed in addition to 'ref'");
		    break;
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* No children except <annotation> expected.
	*/
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL, "(annotation?)");
	}
	if ((min == 0) && (max == 0))
	    goto return_null;
	/*
	* Create the reference item and attach it to the particle.
	*/
	refer = xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_ELEMENT,
	    ref, refNs);
	if (refer == NULL)
	    goto return_null;
	particle->children = (xmlSchemaTreeItemPtr) refer;
	particle->annot = annot;
	/*
	* Add the particle to pending components, since the reference
	* need to be resolved.
	*/
	WXS_ADD_PENDING(ctxt, particle);
	return ((xmlSchemaBasicItemPtr) particle);
    }
    /*
    * The declaration part ===============================================
    */
declaration_part:
    {
	const xmlChar *ns = NULL, *fixed, *name, *attrValue;
	xmlSchemaIDCPtr curIDC = NULL, lastIDC = NULL;

	if (xmlSchemaPValAttrNode(ctxt, NULL, nameAttr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0)
	    goto return_null;
	/*
	* Evaluate the target namespace.
	*/
	if (topLevel) {
	    ns = ctxt->targetNamespace;
	} else {
	    attr = xmlSchemaGetPropNode(node, "form");
	    if (attr != NULL) {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlStrEqual(attrValue, BAD_CAST "qualified")) {
		    ns = ctxt->targetNamespace;
		} else if (!xmlStrEqual(attrValue, BAD_CAST "unqualified")) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(qualified | unqualified)",
			attrValue, NULL, NULL, NULL);
		}
	    } else if (schema->flags & XML_SCHEMAS_QUALIF_ELEM)
		ns = ctxt->targetNamespace;
	}
	decl = xmlSchemaAddElement(ctxt, name, ns, node, topLevel);
	if (decl == NULL) {
	    goto return_null;
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "type")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "default")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "fixed")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "block")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "nillable")))
		{
		    if (topLevel == 0) {
			if ((!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "form")))
			{
			    xmlSchemaPIllegalAttrErr(ctxt,
				XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
			}
		    } else if ((!xmlStrEqual(attr->name, BAD_CAST "final")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "abstract")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "substitutionGroup"))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {

		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Extract/validate attributes.
	*/
	if (topLevel) {
	    /*
	    * Process top attributes of global element declarations here.
	    */
	    decl->flags |= XML_SCHEMAS_ELEM_GLOBAL;
	    decl->flags |= XML_SCHEMAS_ELEM_TOPLEVEL;
	    xmlSchemaPValAttrQName(ctxt, schema,
		NULL, node, "substitutionGroup",
		&(decl->substGroupNs), &(decl->substGroup));
	    if (xmlGetBooleanProp(ctxt, node, "abstract", 0))
		decl->flags |= XML_SCHEMAS_ELEM_ABSTRACT;
	    /*
	    * Attribute "final".
	    */
	    attr = xmlSchemaGetPropNode(node, "final");
	    if (attr == NULL) {
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_EXTENSION;
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_RESTRICTION;
	    } else {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		    -1,
		    XML_SCHEMAS_ELEM_FINAL_EXTENSION,
		    XML_SCHEMAS_ELEM_FINAL_RESTRICTION, -1, -1, -1) != 0) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(#all | List of (extension | restriction))",
			attrValue, NULL, NULL, NULL);
		}
	    }
	}
	/*
	* Attribute "block".
	*/
	attr = xmlSchemaGetPropNode(node, "block");
	if (attr == NULL) {
	    /*
	    * Apply default "block" values.
	    */
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_EXTENSION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_SUBSTITUTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION;
	} else {
	    attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		-1,
		XML_SCHEMAS_ELEM_BLOCK_EXTENSION,
		XML_SCHEMAS_ELEM_BLOCK_RESTRICTION,
		XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION, -1, -1) != 0) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    NULL, "(#all | List of (extension | "
		    "restriction | substitution))", attrValue,
		    NULL, NULL, NULL);
	    }
	}
	if (xmlGetBooleanProp(ctxt, node, "nillable", 0))
	    decl->flags |= XML_SCHEMAS_ELEM_NILLABLE;

	attr = xmlSchemaGetPropNode(node, "type");
	if (attr != NULL) {
	    xmlSchemaPValAttrNodeQName(ctxt, schema,
		NULL, attr,
		&(decl->namedTypeNs), &(decl->namedType));
	    xmlSchemaCheckReference(ctxt, schema, node,
		attr, decl->namedTypeNs);
	}
	decl->value = xmlSchemaGetProp(ctxt, node, "default");
	attr = xmlSchemaGetPropNode(node, "fixed");
	if (attr != NULL) {
	    fixed = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (decl->value != NULL) {
		/*
		* 3.3.3 : 1
		* default and fixed must not both be present.
		*/
		xmlSchemaPMutualExclAttrErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_1,
		    NULL, attr, "default", "fixed");
	    } else {
		decl->flags |= XML_SCHEMAS_ELEM_FIXED;
		decl->value = fixed;
	    }
	}
	/*
	* And now for the children...
	*/
	if (IS_SCHEMA(child, "complexType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are mutually
	    * exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <complexType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseComplexType(ctxt, schema, child, 0);
	    child = child->next;
	} else if (IS_SCHEMA(child, "simpleType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are
	    * mutually exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <simpleType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseSimpleType(ctxt, schema, child, 0);
	    child = child->next;
	}
	while ((IS_SCHEMA(child, "unique")) ||
	    (IS_SCHEMA(child, "key")) || (IS_SCHEMA(child, "keyref"))) {
	    if (IS_SCHEMA(child, "unique")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_UNIQUE, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "key")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEY, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "keyref")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEYREF, decl->targetNamespace);
	    }
	    if (lastIDC != NULL)
		lastIDC->next = curIDC;
	    else
		decl->idcs = (void *) curIDC;
	    lastIDC = curIDC;
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child,
		NULL, "(annotation?, ((simpleType | complexType)?, "
		"(unique | key | keyref)*))");
	}
	decl->annot = annot;
    }
    /*
    * NOTE: Element Declaration Representation OK 4. will be checked at a
    * different layer.
    */
    FREE_AND_NULL(des)
    if (topLevel)
	return ((xmlSchemaBasicItemPtr) decl);
    else {
	particle->children = (xmlSchemaTreeItemPtr) decl;
	return ((xmlSchemaBasicItemPtr) particle);
    }

return_null:
    FREE_AND_NULL(des);
    if (annot != NULL) {
	if (particle != NULL)
	    particle->annot = NULL;
	if (decl != NULL)
	    decl->annot = NULL;
	xmlSchemaFreeAnnot(annot);
    }
    return (NULL);
}